

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

int Llb_Nonlin4Quantify1(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart)

{
  uint uVar1;
  DdNode *f;
  Llb_Var_t *pVar;
  int *piVar2;
  Llb_Prt_t *pLVar3;
  int iVar4;
  DdNode *n;
  DdNode *n_00;
  uint *__ptr;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  
  n = Llb_Nonlin4CreateCube1(p,pPart);
  Cudd_Ref(n);
  f = pPart->bFunc;
  n_00 = Cudd_bddExistAbstract(p->dd,f,n);
  pPart->bFunc = n_00;
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(p->dd,f);
  Cudd_RecursiveDeref(p->dd,n);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  iVar4 = Cudd_DagSize(pPart->bFunc);
  Extra_SupportArray(p->dd,pPart->bFunc,p->pSupp);
  pVVar5 = pPart->vVars;
  if (0 < pVVar5->nSize) {
    lVar14 = 0;
    do {
      pVar = p->pVars[pVVar5->pArray[lVar14]];
      pVVar5 = pVar->vParts;
      if (p->pSupp[pVar->iVar] == 0) {
        uVar1 = pVVar5->nSize;
        uVar9 = 0;
        bVar16 = 0 < (int)uVar1;
        if (0 < (int)uVar1) {
          bVar16 = true;
          if (*pVVar5->pArray != pPart->iPart) {
            uVar13 = 0;
            do {
              if ((ulong)uVar1 - 1 == uVar13) {
                bVar16 = false;
                uVar9 = (ulong)uVar1;
                goto LAB_007dcde9;
              }
              uVar9 = uVar13 + 1;
              lVar15 = uVar13 + 1;
              uVar13 = uVar9;
            } while (pVVar5->pArray[lVar15] != pPart->iPart);
            bVar16 = uVar9 < uVar1;
          }
        }
LAB_007dcde9:
        uVar8 = (uint)uVar9;
        if (uVar8 == uVar1) {
LAB_007dcfcd:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                        ,0x120,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
        }
        if (!bVar16) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x3c1,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar11 = uVar1;
        if ((int)(uVar8 + 1) < (int)uVar1) {
          piVar2 = pVVar5->pArray;
          piVar10 = piVar2 + (uVar8 + 1);
          uVar9 = uVar9 & 0xffffffff;
          do {
            iVar12 = (int)uVar9;
            piVar2[uVar9] = *piVar10;
            uVar11 = pVVar5->nSize;
            piVar10 = piVar10 + 1;
            uVar9 = (ulong)(iVar12 + 1);
          } while (iVar12 + 2 < (int)uVar11);
        }
        pVVar5->nSize = uVar11 - 1;
        if (uVar8 == uVar1) goto LAB_007dcfcd;
        pVar->nScore = pVar->nScore - pPart->nSize;
        if (pVVar5->nSize != 1) {
          if (pVVar5->nSize == 0) {
            Llb_Nonlin4RemoveVar(p,pVar);
          }
          goto LAB_007dcd91;
        }
        pLVar3 = p->pParts[*pVVar5->pArray];
        uVar1 = __ptr[1];
        lVar15 = (long)(int)uVar1;
        if (0 < lVar15) {
          lVar7 = 0;
          do {
            if (*(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar7 * 8) == pLVar3) goto LAB_007dcd91;
            lVar7 = lVar7 + 1;
          } while (lVar15 != lVar7);
        }
        uVar8 = *__ptr;
        if (uVar1 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar11 = 0x10;
          }
          else {
            uVar11 = uVar8 * 2;
            if ((int)uVar11 <= (int)uVar8) goto LAB_007dcf02;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar8 << 4);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar8 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = uVar11;
        }
LAB_007dcf02:
        __ptr[1] = uVar1 + 1;
        *(Llb_Prt_t **)(*(long *)(__ptr + 2) + lVar15 * 8) = pLVar3;
      }
      else {
        if (pVVar5->nSize < 2) {
          __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                        ,0x11a,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
        }
        pVar->nScore = pVar->nScore + (iVar4 - pPart->nSize);
      }
LAB_007dcd91:
      lVar14 = lVar14 + 1;
      pVVar5 = pPart->vVars;
    } while (lVar14 < pVVar5->nSize);
  }
  pPart->nSize = iVar4;
  pVVar5->nSize = 0;
  if (0 < p->nVars) {
    lVar14 = 0;
    do {
      if (p->pSupp[lVar14] != 0) {
        if (p->vVars2Q->nSize <= lVar14) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vVars2Q->pArray[lVar14] != 0) {
          Vec_IntPush(pPart->vVars,(int)lVar14);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nVars);
  }
  uVar1 = __ptr[1];
  if (0 < (long)(int)uVar1) {
    lVar14 = *(long *)(__ptr + 2);
    lVar15 = 0;
    do {
      Llb_Nonlin4Quantify1(p,*(Llb_Prt_t **)(lVar14 + lVar15 * 8));
      lVar15 = lVar15 + 1;
    } while ((int)uVar1 != lVar15);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return 0;
}

Assistant:

int Llb_Nonlin4Quantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    // create cube to be quantified
    bCube = Llb_Nonlin4CreateCube1( p, pPart );   Cudd_Ref( bCube );
//    assert( !Cudd_IsConstant(bCube) );
    // derive new function
    pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
    Cudd_RecursiveDeref( p->dd, bTemp );
    Cudd_RecursiveDeref( p->dd, bCube );
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_Nonlin4RemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && Vec_IntEntry(p->vVars2Q, i) )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_Nonlin4Quantify1( p, pTemp );
    Vec_PtrFree( vSingles );
    return 0;
}